

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O3

int IterativelyApplyExorLink4(char fDistEnable)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Cube **ppCVar4;
  
  s_Dist = DIST4;
  uVar2 = (uint)(byte)fDistEnable;
  s_fDistEnable2 = uVar2 & 1;
  s_fDistEnable3 = uVar2 & 2;
  s_fDistEnable4 = uVar2 & 4;
  s_cEnquequed = ((s_Que[2].PosIn - s_Que[2].PosOut) + s_nPosAlloc) % s_nPosAlloc;
  s_cAttempts = 0;
  s_cReshapes = 0;
  s_nCubesBefore = g_CoverInfo.nCubesInUse;
  iVar1 = IteratorCubePairStart(DIST4,&s_pC1,&s_pC2);
  do {
    if (iVar1 == 0) {
      if (g_CoverInfo.Verbosity == 2) {
        printf("ExLink-%d",4);
        printf(": Que= %5d",(ulong)(uint)s_cEnquequed);
        printf("  Att= %4d",(ulong)(uint)s_cAttempts);
        printf("  Resh= %4d",(ulong)(uint)s_cReshapes);
        printf("  NoResh= %4d",(ulong)(uint)(s_cAttempts - s_cReshapes));
        printf("  Cubes= %3d",(ulong)(uint)g_CoverInfo.nCubesInUse);
        printf("  (%d)",(ulong)(uint)(s_nCubesBefore - g_CoverInfo.nCubesInUse));
        uVar2 = CountLiterals();
        printf("  Lits= %5d",(ulong)uVar2);
        uVar2 = CountQCost();
        printf("  QCost = %6d",(ulong)uVar2);
        putchar(10);
      }
      return s_nCubesBefore - g_CoverInfo.nCubesInUse;
    }
    s_cAttempts = s_cAttempts + 1;
    iVar1 = ExorLinkCubeIteratorStart(s_CubeGroup,s_pC1,s_pC2,s_Dist);
    if (iVar1 != 0) {
      CubeExtract(s_pC1);
      CubeExtract(s_pC2);
      s_Que[0].PosMark = s_Que[0].PosIn;
      s_Que[1].PosMark = s_Que[1].PosIn;
      s_Que[2].PosMark = s_Que[2].PosIn;
      do {
        s_GainTotal = 0;
        lVar3 = 0;
        ppCVar4 = s_CubeGroup;
        iVar1 = 0;
        do {
          uVar2 = 0;
          if ((*ppCVar4)->fMark == '\0') {
            iVar1 = CheckForCloseCubes(*ppCVar4,0);
            uVar2 = (uint)(0 < iVar1);
            iVar1 = iVar1 + s_GainTotal;
            s_GainTotal = iVar1;
          }
          *(uint *)((long)s_fInserted + lVar3) = uVar2;
          lVar3 = lVar3 + 4;
          ppCVar4 = ppCVar4 + 1;
        } while (lVar3 != 0x10);
        if (iVar1 != 0) {
          if (iVar1 == 1) {
            UndoRecentChanges();
            lVar3 = 0;
            ppCVar4 = s_CubeGroup;
            do {
              (*ppCVar4)->fMark = *(int *)((long)s_fInserted + lVar3) == 0;
              ppCVar4 = ppCVar4 + 1;
              lVar3 = lVar3 + 4;
            } while (lVar3 != 0x10);
            goto LAB_0034e129;
          }
          lVar3 = 0;
          ppCVar4 = s_CubeGroup;
          do {
            if (*(int *)((long)s_fInserted + lVar3) == 0) {
              CheckForCloseCubes(*ppCVar4,1);
            }
            ppCVar4 = ppCVar4 + 1;
            lVar3 = lVar3 + 4;
          } while (lVar3 != 0x10);
          ExorLinkCubeIteratorCleanUp(1);
          AddToFreeCubes(s_pC1);
          AddToFreeCubes(s_pC2);
          s_cReshapes = s_cReshapes + 1;
          goto LAB_0034e1cf;
        }
        lVar3 = 0;
        do {
          **(undefined1 **)((long)s_CubeGroup + lVar3) = 1;
          lVar3 = lVar3 + 8;
        } while (lVar3 != 0x20);
LAB_0034e129:
        s_Que[0].PosIn = s_Que[0].PosMark;
        s_Que[1].PosIn = s_Que[1].PosMark;
        s_Que[2].PosIn = s_Que[2].PosMark;
        iVar1 = ExorLinkCubeIteratorNext(s_CubeGroup);
      } while (iVar1 != 0);
      CubeInsert(s_pC1);
      CubeInsert(s_pC2);
      ExorLinkCubeIteratorCleanUp(0);
    }
LAB_0034e1cf:
    iVar1 = IteratorCubePairNext();
  } while( true );
}

Assistant:

int IterativelyApplyExorLink4( char fDistEnable )   
{
    int z, c;
    // this var is specific to ExorLink-4
    s_Dist = (cubedist)2;

    // enable pair accumulation
    s_fDistEnable2 = fDistEnable & 1;
    s_fDistEnable3 = fDistEnable & 2;
    s_fDistEnable4 = fDistEnable & 4;

    // initialize counters
    s_cEnquequed = GetQuequeStats( s_Dist );
    s_cAttempts  = 0;
    s_cReshapes  = 0;

    // remember the number of cubes before minimization
    s_nCubesBefore = g_CoverInfo.nCubesInUse;

    for ( z = IteratorCubePairStart( s_Dist, &s_pC1, &s_pC2 ); z; z = IteratorCubePairNext() )
    {
        s_cAttempts++;
        // start ExorLink of the given Distance
        if ( ExorLinkCubeIteratorStart( s_CubeGroup, s_pC1, s_pC2, s_Dist ) )
        {
            // extract old cubes from storage (to prevent EXORing with their derivitives)
            CubeExtract( s_pC1 );
            CubeExtract( s_pC2 );

            // mark the current position in the cube pair queques
            MarkSet();

            // check cube groups one by one
            do  
            {   // check the cubes of this group one by one
                s_GainTotal = 0;
                for ( c = 0; c < 4; c++ )
                if ( !s_CubeGroup[c]->fMark ) // this cube has not yet been checked
                {
                    s_Gain = CheckForCloseCubes( s_CubeGroup[c], 0 ); // do not insert the cube, by default
                    // if the cube leads to gain, it is already inserted
                    s_fInserted[c] = (int)(s_Gain>0);
                    // increment the total gain
                    s_GainTotal += s_Gain;
                }
                else
                    s_fInserted[c] = 0; // the cube has already been checked - it is not inserted

                if ( s_GainTotal == 0 ) // the group does not lead to any gain
                { // mark the cubes
                    for ( c = 0; c < 4; c++ )
                        s_CubeGroup[c]->fMark = 1;
                }
                else if ( s_GainTotal == 1 ) // the group does not lead to substantial gain, too
                { 
                    // undo changes to be able to continue checking groups
                    UndoRecentChanges();
                    // mark those cubes that were not inserted
                    for ( c = 0; c < 4; c++ )
                        s_CubeGroup[c]->fMark = !s_fInserted[c];
                }
                else // if ( s_GainTotal > 1 ) // the group reshapes or improves
                { // accept the group
                    for ( c = 0; c < 4; c++ ) // insert other cubes
                        if ( !s_fInserted[c] )
                            CheckForCloseCubes( s_CubeGroup[c], 1 ); 
//                          CheckAndInsert( s_CubeGroup[c] );
                    // clean the results of generating ExorLinked cubes
                    ExorLinkCubeIteratorCleanUp( 1 ); // take the last group
                    // free old cubes
                    AddToFreeCubes( s_pC1 );
                    AddToFreeCubes( s_pC2 );
                    // update the counter
                    s_cReshapes++;
                    goto END_OF_LOOP;
                }
                                        
                // rewind to the previously marked position in the cube pair queques
                MarkRewind();
            } 
            while ( ExorLinkCubeIteratorNext( s_CubeGroup ) );
            // none of the groups leads to improvement

            // return the old cubes back to storage
            CubeInsert( s_pC1 );
            CubeInsert( s_pC2 );
            // clean the results of generating ExorLinked cubes
            ExorLinkCubeIteratorCleanUp( 0 );
        }
END_OF_LOOP: {}
    }

    // print the report
    if ( g_CoverInfo.Verbosity == 2 )
    {
    printf( "ExLink-%d", 4 );
    printf( ": Que= %5d", s_cEnquequed );
    printf( "  Att= %4d", s_cAttempts );
    printf( "  Resh= %4d", s_cReshapes );
    printf( "  NoResh= %4d", s_cAttempts - s_cReshapes );
    printf( "  Cubes= %3d", g_CoverInfo.nCubesInUse );
    printf( "  (%d)", s_nCubesBefore - g_CoverInfo.nCubesInUse );
    printf( "  Lits= %5d", CountLiterals() );
    printf( "  QCost = %6d", CountQCost() );
    printf( "\n" );
    }

    // return the number of cubes gained in the process
    return s_nCubesBefore - g_CoverInfo.nCubesInUse;
}